

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall APlayerPawn::GiveDeathmatchInventory(APlayerPawn *this)

{
  bool bVar1;
  AInventory *this_00;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < PClassActor::AllActorClasses.Count; uVar2 = uVar2 + 1) {
    bVar1 = PClass::IsAncestorOf
                      (AKey::RegistrationInfo.MyClass,
                       &PClassActor::AllActorClasses.Array[uVar2]->super_PClass);
    if ((bVar1) &&
       ((PClassActor::AllActorClasses.Array[uVar2]->super_PClass).Defaults[0x4dc] != '\0')) {
      this_00 = (AInventory *)Spawn(PClassActor::AllActorClasses.Array[uVar2]);
      bVar1 = AInventory::CallTryPickup(this_00,&this->super_AActor,(AActor **)0x0);
      if (!bVar1) {
        (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this_00);
      }
    }
  }
  return;
}

Assistant:

void APlayerPawn::GiveDeathmatchInventory()
{
	for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
	{
		if (PClassActor::AllActorClasses[i]->IsDescendantOf (RUNTIME_CLASS(AKey)))
		{
			AKey *key = (AKey *)GetDefaultByType (PClassActor::AllActorClasses[i]);
			if (key->KeyNumber != 0)
			{
				key = static_cast<AKey *>(Spawn(static_cast<PClassActor *>(PClassActor::AllActorClasses[i])));
				if (!key->CallTryPickup (this))
				{
					key->Destroy ();
				}
			}
		}
	}
}